

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<double,double,double,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool,false,false>
               (double *ldata,double *rdata,double *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  double *__x;
  double dVar1;
  double __y;
  double *pdVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  byte bVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  idx_t idx_in_entry_1;
  ulong uVar11;
  idx_t idx_in_entry;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  double *local_90;
  double *local_88;
  idx_t local_80;
  double *local_78;
  double *local_70;
  idx_t local_68;
  ulong local_60;
  buffer_ptr<ValidityBuffer> *local_58;
  double local_50;
  ulong local_48;
  double *local_40;
  double *local_38;
  
  local_78 = rdata;
  local_70 = ldata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar12 = 0;
      do {
        pdVar2 = (double *)local_70[uVar12];
        uVar15 = SUB84(pdVar2,0);
        uVar16 = (undefined4)((ulong)pdVar2 >> 0x20);
        dVar1 = local_78[uVar12];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar1 = fmod((double)pdVar2,dVar1);
          uVar15 = SUB84(dVar1,0);
          uVar16 = (undefined4)((ulong)dVar1 >> 0x20);
        }
        else {
          _Var10._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var10._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            local_88 = pdVar2;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var8 = p_Stack_a0;
            peVar7 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar7;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var8;
            if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var10._M_head_impl =
                 (pTVar9->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var10._M_head_impl;
            uVar15 = SUB84(local_88,0);
            uVar16 = (undefined4)((ulong)local_88 >> 0x20);
          }
          bVar6 = (byte)uVar12 & 0x3f;
          _Var10._M_head_impl[uVar12 >> 6] =
               _Var10._M_head_impl[uVar12 >> 6] &
               (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        result_data[uVar12] = (double)CONCAT44(uVar16,uVar15);
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    local_58 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_48 = 0;
    uVar12 = 0;
    local_90 = result_data;
    local_68 = count;
    do {
      pdVar2 = local_78;
      puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar14 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar14 = count;
        }
LAB_009da2ab:
        uVar13 = uVar12;
        if (uVar12 < uVar14) {
          do {
            __x = (double *)local_70[uVar12];
            uVar15 = SUB84(__x,0);
            uVar16 = (undefined4)((ulong)__x >> 0x20);
            dVar1 = pdVar2[uVar12];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              dVar1 = fmod((double)__x,dVar1);
              uVar15 = SUB84(dVar1,0);
              uVar16 = (undefined4)((ulong)dVar1 >> 0x20);
            }
            else {
              _Var10._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
              ;
              if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                local_80 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                local_88 = __x;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_a8,&local_80);
                p_Var8 = p_Stack_a0;
                peVar7 = local_a8;
                local_a8 = (element_type *)0x0;
                p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar7;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var8;
                if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
                   p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                }
                pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_58);
                _Var10._M_head_impl =
                     (pTVar9->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var10._M_head_impl;
                uVar15 = SUB84(local_88,0);
                uVar16 = (undefined4)((ulong)local_88 >> 0x20);
              }
              bVar6 = (byte)uVar12 & 0x3f;
              _Var10._M_head_impl[uVar12 >> 6] =
                   _Var10._M_head_impl[uVar12 >> 6] &
                   (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
            }
            result_data[uVar12] = (double)CONCAT44(uVar16,uVar15);
            uVar12 = uVar12 + 1;
            uVar13 = uVar14;
          } while (uVar14 != uVar12);
        }
      }
      else {
        uVar4 = puVar3[local_48];
        uVar14 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar14 = count;
        }
        result_data = local_90;
        uVar13 = uVar14;
        if (uVar4 != 0) {
          if (uVar4 == 0xffffffffffffffff) goto LAB_009da2ab;
          count = local_68;
          uVar13 = uVar12;
          if (uVar12 < uVar14) {
            local_88 = local_90 + uVar12;
            local_38 = local_78 + uVar12;
            local_40 = local_70 + uVar12;
            uVar11 = 0;
            do {
              if ((uVar4 >> (uVar11 & 0x3f) & 1) != 0) {
                dVar1 = local_40[uVar11];
                uVar15 = SUB84(dVar1,0);
                uVar16 = (undefined4)((ulong)dVar1 >> 0x20);
                __y = local_38[uVar11];
                if ((__y != 0.0) || (NAN(__y))) {
                  dVar1 = fmod(dVar1,__y);
                  uVar15 = SUB84(dVar1,0);
                  uVar16 = (undefined4)((ulong)dVar1 >> 0x20);
                }
                else {
                  _Var10._M_head_impl =
                       (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                  if (_Var10._M_head_impl == (unsigned_long *)0x0) {
                    local_80 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    local_50 = dVar1;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_a8,&local_80);
                    p_Var8 = p_Stack_a0;
                    peVar7 = local_a8;
                    local_a8 = (element_type *)0x0;
                    p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar7;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var8;
                    if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
                       p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                    }
                    pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_58);
                    _Var10._M_head_impl =
                         (pTVar9->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var10._M_head_impl;
                    uVar15 = SUB84(local_50,0);
                    uVar16 = (undefined4)((ulong)local_50 >> 0x20);
                  }
                  bVar6 = (byte)(uVar12 + uVar11) & 0x3f;
                  _Var10._M_head_impl[uVar12 + uVar11 >> 6] =
                       _Var10._M_head_impl[uVar12 + uVar11 >> 6] &
                       (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                }
                local_88[uVar11] = (double)CONCAT44(uVar16,uVar15);
              }
              uVar11 = uVar11 + 1;
              result_data = local_90;
              count = local_68;
              uVar13 = uVar14;
            } while (uVar14 - uVar12 != uVar11);
          }
        }
      }
      local_48 = local_48 + 1;
      uVar12 = uVar13;
    } while (local_48 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}